

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageStoreCase::iterate(ImageStoreCase *this)

{
  TextureFormat *format;
  pointer *pppSVar1;
  deUint32 *pdVar2;
  ChannelType CVar3;
  ChannelType CVar4;
  TestLog *pTVar5;
  bool bVar6;
  int num_groups_y;
  ImageStoreCase *pIVar7;
  undefined4 uVar8;
  int i;
  int iVar9;
  deUint32 dVar10;
  ContextType type;
  GLSLVersion version;
  int iVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  ulong uVar13;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar14;
  undefined4 extraout_var_01;
  size_t sVar15;
  long *plVar16;
  undefined8 *puVar17;
  char *pcVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 uVar19;
  size_type *psVar20;
  Functions *pFVar21;
  RenderContext *renderContext;
  long *plVar22;
  ulong *puVar23;
  TextureFormat *format_00;
  bool *__s;
  long lVar24;
  uint x;
  ulong uVar25;
  undefined1 isSampler;
  TextureType formatType;
  uint y;
  uint uVar26;
  uint uVar27;
  GLenum target;
  bool bVar28;
  float fVar29;
  IVec3 local_678;
  float local_66c;
  RenderContext *local_668;
  uint local_65c;
  string glslVersionDeclaration;
  Vector<float,_4> res_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  TestLog *local_610;
  string colorExpr;
  ulong *local_5d8;
  long local_5d0;
  ulong local_5c8;
  long lStack_5c0;
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8;
  long lStack_5a0;
  long *local_598;
  undefined8 local_590;
  long local_588;
  undefined8 uStack_580;
  ImageStoreCase *local_578;
  ulong *local_570;
  long local_568;
  ulong local_560;
  long lStack_558;
  ulong *local_550;
  long local_548;
  ulong local_540;
  undefined8 uStack_538;
  ulong *local_530;
  long local_528;
  ulong local_520;
  long lStack_518;
  ulong *local_510;
  long local_508;
  ulong local_500;
  long lStack_4f8;
  ulong *local_4f0;
  long local_4e8;
  ulong local_4e0;
  long lStack_4d8;
  ulong *local_4d0;
  long local_4c8;
  ulong local_4c0;
  long lStack_4b8;
  long *local_4b0;
  undefined8 local_4a8;
  long local_4a0;
  undefined8 uStack_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  CallLogWrapper glLog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_438;
  undefined8 local_430;
  long local_428;
  undefined8 uStack_420;
  string shaderImageTypeStr;
  string colorBaseExpr;
  Texture texture;
  string shaderImageFormatStr;
  string local_398;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  Buffer textureBuf;
  UniformAccessLogger uniforms;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [32];
  ShaderProgram program;
  
  local_668 = ((this->super_TestCase).m_context)->m_renderCtx;
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar9 = (*local_668->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar9),pTVar5);
  dVar10 = glu::getInternalFormat(this->m_format);
  uVar13 = (ulong)this->m_textureType;
  target = 0xffffffff;
  if (uVar13 < 8) {
    target = *(GLenum *)(&DAT_01c93968 + uVar13 * 4);
  }
  switch(uVar13) {
  case 0:
  case 1:
    local_678.m_data[0] = 0x40;
    local_678.m_data[1] = 0x40;
    goto LAB_01495031;
  case 2:
  case 3:
    local_678.m_data[0] = 0x40;
    local_678.m_data[1] = 0x40;
    local_678.m_data[2] = 8;
    break;
  default:
    local_678.m_data[2] = 0xffffffff;
    local_678.m_data[0] = -1;
    local_678.m_data[1] = -1;
    break;
  case 7:
    local_678.m_data[0] = 0x40;
    local_678.m_data[1] = 1;
LAB_01495031:
    local_678.m_data[2] = 1;
  }
  local_65c = 6;
  if (this->m_textureType != TEXTURETYPE_CUBE) {
    local_65c = local_678.m_data[2];
  }
  uVar26 = local_678.m_data[2];
  if (local_678.m_data[2] < local_678.m_data[1]) {
    uVar26 = local_678.m_data[1];
  }
  if ((int)uVar26 < local_678.m_data[0]) {
    uVar26 = local_678.m_data[0];
  }
  CVar3 = (this->m_format).type;
  if ((CVar3 < UNORM_BYTE_44) && ((0x58U >> (CVar3 & UNSIGNED_INT16) & 1) != 0)) {
    local_66c = 1.0;
LAB_0149508e:
    local_66c = local_66c / (float)(int)(uVar26 - 1);
  }
  else {
    if (CVar3 < UNORM_INT8) {
      local_66c = 2.0;
      goto LAB_0149508e;
    }
    local_66c = 1.0;
  }
  if (CVar3 < UNORM_INT8) {
    fVar29 = -1.0;
  }
  else {
    fVar29 = 0.0;
  }
  iVar9 = (*local_668->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&textureBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar9),pOVar14);
  iVar9 = (*local_668->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar9),pOVar14);
  glLog.m_enableLog = true;
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar5,0);
  uVar8 = program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = (deUint32)((ulong)pTVar5 >> 0x20);
  dVar12 = program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start._4_4_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar8;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = dVar12;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,target,texture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  isSampler = (undefined1)textureBuf.super_ObjectWrapper.m_object;
  setTextureStorage(&glLog,this->m_textureType,dVar10,&local_678,
                    textureBuf.super_ObjectWrapper.m_object);
  format = &this->m_format;
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)format,format_00);
  formatType = this->m_textureType;
  uVar13 = (ulong)formatType;
  if ((this->m_singleLayerBind == true) &&
     (bVar28 = formatType < TEXTURETYPE_LAST, formatType = TEXTURETYPE_LAST, bVar28)) {
    formatType = *(TextureType *)(&DAT_01c93948 + uVar13 * 4);
  }
  local_610 = pTVar5;
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,formatType,
             TEXTURETYPE_2D,(bool)isSampler);
  CVar4 = (this->m_format).type;
  __s = (bool *)0x1c858c1;
  if (2 < CVar4 - SIGNED_INT8) {
    __s = glcts::fixed_sample_locations_values + 1;
  }
  if ((CVar4 & ~SNORM_INT16) == UNSIGNED_INT8) {
    __s = (bool *)0x1b19cf4;
  }
  if (CVar4 == UNSIGNED_INT32) {
    __s = (bool *)0x1b19cf4;
  }
  local_598 = &local_588;
  sVar15 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,__s,__s + sVar15);
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_598);
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_5c8 = *puVar23;
    lStack_5c0 = plVar16[3];
    local_5d8 = &local_5c8;
  }
  else {
    local_5c8 = *puVar23;
    local_5d8 = (ulong *)*plVar16;
  }
  local_5d0 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  iVar9 = local_678.m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar9 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar13 = 0xf;
  if (local_5d8 != &local_5c8) {
    uVar13 = local_5c8;
  }
  if (uVar13 < (ulong)(local_5b0 + local_5d0)) {
    uVar13 = 0xf;
    if (local_5b8 != &local_5a8) {
      uVar13 = local_5a8;
    }
    if (uVar13 < (ulong)(local_5b0 + local_5d0)) goto LAB_0149543f;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_5d8);
  }
  else {
LAB_0149543f:
    puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_5b8);
  }
  local_4b0 = &local_4a0;
  plVar16 = puVar17 + 2;
  if ((long *)*puVar17 == plVar16) {
    local_4a0 = *plVar16;
    uStack_498 = puVar17[3];
  }
  else {
    local_4a0 = *plVar16;
    local_4b0 = (long *)*puVar17;
  }
  local_4a8 = puVar17[1];
  *puVar17 = plVar16;
  puVar17[1] = 0;
  *(undefined1 *)plVar16 = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_4b0);
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_4c0 = *puVar23;
    lStack_4b8 = plVar16[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *puVar23;
    local_4d0 = (ulong *)*plVar16;
  }
  local_4c8 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  iVar9 = local_678.m_data[1];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar9 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar13 = 0xf;
  if (local_4d0 != &local_4c0) {
    uVar13 = local_4c0;
  }
  if (uVar13 < (ulong)(local_4e8 + local_4c8)) {
    uVar13 = 0xf;
    if (local_4f0 != &local_4e0) {
      uVar13 = local_4e0;
    }
    if (uVar13 < (ulong)(local_4e8 + local_4c8)) goto LAB_014955e8;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,(ulong)local_4d0);
  }
  else {
LAB_014955e8:
    puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_4f0);
  }
  glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
  psVar20 = puVar17 + 2;
  if ((size_type *)*puVar17 == psVar20) {
    glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
    glslVersionDeclaration.field_2._8_8_ = puVar17[3];
  }
  else {
    glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
    glslVersionDeclaration._M_dataplus._M_p = (pointer)*puVar17;
  }
  glslVersionDeclaration._M_string_length = puVar17[1];
  *puVar17 = psVar20;
  puVar17[1] = 0;
  *(char *)psVar20 = '\0';
  plVar16 = (long *)std::__cxx11::string::append((char *)&glslVersionDeclaration);
  local_570 = &local_560;
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_560 = *puVar23;
    lStack_558 = plVar16[3];
  }
  else {
    local_560 = *puVar23;
    local_570 = (ulong *)*plVar16;
  }
  local_568 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  iVar9 = local_678.m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar9 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar13 = 0xf;
  if (local_570 != &local_560) {
    uVar13 = local_560;
  }
  if (uVar13 < (ulong)(local_508 + local_568)) {
    uVar13 = 0xf;
    if (local_510 != &local_500) {
      uVar13 = local_500;
    }
    if (uVar13 < (ulong)(local_508 + local_568)) goto LAB_0149576c;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_510,0,(char *)0x0,(ulong)local_570);
  }
  else {
LAB_0149576c:
    puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_510);
  }
  colorExpr._M_dataplus._M_p = (pointer)&colorExpr.field_2;
  psVar20 = puVar17 + 2;
  if ((size_type *)*puVar17 == psVar20) {
    colorExpr.field_2._M_allocated_capacity = *psVar20;
    colorExpr.field_2._8_8_ = puVar17[3];
  }
  else {
    colorExpr.field_2._M_allocated_capacity = *psVar20;
    colorExpr._M_dataplus._M_p = (pointer)*puVar17;
  }
  colorExpr._M_string_length = puVar17[1];
  *puVar17 = psVar20;
  puVar17[1] = 0;
  *(char *)psVar20 = '\0';
  plVar16 = (long *)std::__cxx11::string::append((char *)&colorExpr);
  res_2.m_data._0_8_ = &local_628;
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_628._M_allocated_capacity = *puVar23;
    local_628._8_8_ = plVar16[3];
  }
  else {
    local_628._M_allocated_capacity = *puVar23;
    res_2.m_data._0_8_ = (ulong *)*plVar16;
  }
  res_2.m_data._8_8_ = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  iVar9 = local_678.m_data[1];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar9 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_2.m_data._0_8_ != &local_628) {
    uVar19 = local_628._M_allocated_capacity;
  }
  if ((ulong)uVar19 < (ulong)(local_528 + res_2.m_data._8_8_)) {
    uVar13 = 0xf;
    if (local_530 != &local_520) {
      uVar13 = local_520;
    }
    if (uVar13 < (ulong)(local_528 + res_2.m_data._8_8_)) goto LAB_014958e7;
    plVar16 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_530,0,(char *)0x0,res_2.m_data._0_8_);
  }
  else {
LAB_014958e7:
    plVar16 = (long *)std::__cxx11::string::_M_append((char *)&res_2,(ulong)local_530);
  }
  uniforms.m_gl = (Functions *)&uniforms.m_programGL;
  pFVar21 = (Functions *)(plVar16 + 2);
  if ((Functions *)*plVar16 == pFVar21) {
    uniforms._16_8_ = pFVar21->activeShaderProgram;
    uniforms.m_uniformLocations._M_t._M_impl._0_8_ = plVar16[3];
  }
  else {
    uniforms._16_8_ = pFVar21->activeShaderProgram;
    uniforms.m_gl = (Functions *)*plVar16;
  }
  uniforms.m_log = (TestLog *)plVar16[1];
  *plVar16 = (long)pFVar21;
  plVar16[1] = 0;
  *(undefined1 *)&pFVar21->activeShaderProgram = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&uniforms);
  colorBaseExpr._M_dataplus._M_p = (pointer)&colorBaseExpr.field_2;
  psVar20 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar20) {
    colorBaseExpr.field_2._M_allocated_capacity = *psVar20;
    colorBaseExpr.field_2._8_8_ = plVar16[3];
  }
  else {
    colorBaseExpr.field_2._M_allocated_capacity = *psVar20;
    colorBaseExpr._M_dataplus._M_p = (pointer)*plVar16;
  }
  colorBaseExpr._M_string_length = plVar16[1];
  *plVar16 = (long)psVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  pdVar2 = &uniforms.m_programGL;
  if (uniforms.m_gl != (Functions *)pdVar2) {
    operator_delete(uniforms.m_gl,uniforms._16_8_ + 1);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530,local_520 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_2.m_data._0_8_ != &local_628) {
    operator_delete((void *)res_2.m_data._0_8_,local_628._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorExpr._M_dataplus._M_p != &colorExpr.field_2) {
    operator_delete(colorExpr._M_dataplus._M_p,colorExpr.field_2._M_allocated_capacity + 1);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510,local_500 + 1);
  }
  if (local_570 != &local_560) {
    operator_delete(local_570,local_560 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  local_578 = this;
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0,local_4a0 + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,local_5a8 + 1);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,local_5c8 + 1);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598,local_588 + 1);
  }
  if ((local_66c != 1.0) || (NAN(local_66c))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
    std::ostream::_M_insert<double>((double)local_66c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
    std::ios_base::~ios_base
              ((ios_base *)
               &program.m_shaders[4].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_570,0,(char *)0x0,0x1c39262);
    res_2.m_data._0_8_ = &local_628;
    puVar23 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar23) {
      local_628._M_allocated_capacity = *puVar23;
      local_628._8_8_ = plVar16[3];
    }
    else {
      local_628._M_allocated_capacity = *puVar23;
      res_2.m_data._0_8_ = (ulong *)*plVar16;
    }
    res_2.m_data._8_8_ = plVar16[1];
    *plVar16 = (long)puVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
  }
  else {
    res_2.m_data._0_8_ = &local_628;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  plVar16 = (long *)std::__cxx11::string::replace
                              ((ulong)&res_2,0,(char *)0x0,(ulong)colorBaseExpr._M_dataplus._M_p);
  pFVar21 = (Functions *)(plVar16 + 2);
  if ((Functions *)*plVar16 == pFVar21) {
    uniforms._16_8_ = pFVar21->activeShaderProgram;
    uniforms.m_uniformLocations._M_t._M_impl._0_8_ = plVar16[3];
    uniforms.m_gl = (Functions *)pdVar2;
  }
  else {
    uniforms._16_8_ = pFVar21->activeShaderProgram;
    uniforms.m_gl = (Functions *)*plVar16;
  }
  uniforms.m_log = (TestLog *)plVar16[1];
  *plVar16 = (long)pFVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if (CVar3 < UNORM_INT8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
    std::ostream::_M_insert<double>((double)fVar29);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
    std::ios_base::~ios_base
              ((ios_base *)
               &program.m_shaders[4].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_4b0,0,(char *)0x0,0x1c91ec3);
    puVar23 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar23) {
      local_4c0 = *puVar23;
      lStack_4b8 = plVar16[3];
      local_4d0 = &local_4c0;
    }
    else {
      local_4c0 = *puVar23;
      local_4d0 = (ulong *)*plVar16;
    }
    local_4c8 = plVar16[1];
    *plVar16 = (long)puVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_4d0);
    glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    psVar20 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar20) {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
      glslVersionDeclaration.field_2._8_8_ = plVar16[3];
    }
    else {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
      glslVersionDeclaration._M_dataplus._M_p = (pointer)*plVar16;
    }
    glslVersionDeclaration._M_string_length = plVar16[1];
    *plVar16 = (long)psVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
  }
  else {
    glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&glslVersionDeclaration,0x1b32ab9);
  }
  uVar13 = (long)&(uniforms.m_log)->m_log + glslVersionDeclaration._M_string_length;
  uVar25 = 0xf;
  if (uniforms.m_gl != (Functions *)pdVar2) {
    uVar25 = uniforms._16_8_;
  }
  if (uVar25 < uVar13) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
      uVar19 = glslVersionDeclaration.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < uVar13) goto LAB_01495e62;
    plVar16 = (long *)std::__cxx11::string::replace
                                ((ulong)&glslVersionDeclaration,0,(char *)0x0,(ulong)uniforms.m_gl);
  }
  else {
LAB_01495e62:
    plVar16 = (long *)std::__cxx11::string::_M_append
                                ((char *)&uniforms,(ulong)glslVersionDeclaration._M_dataplus._M_p);
  }
  colorExpr._M_dataplus._M_p = (pointer)&colorExpr.field_2;
  renderContext = (RenderContext *)(plVar16 + 2);
  if ((RenderContext *)*plVar16 == renderContext) {
    colorExpr.field_2._M_allocated_capacity = (size_type)renderContext->_vptr_RenderContext;
    colorExpr.field_2._8_8_ = plVar16[3];
  }
  else {
    colorExpr.field_2._M_allocated_capacity = (size_type)renderContext->_vptr_RenderContext;
    colorExpr._M_dataplus._M_p = (pointer)*plVar16;
  }
  colorExpr._M_string_length = plVar16[1];
  *plVar16 = (long)renderContext;
  plVar16[1] = 0;
  *(undefined1 *)&renderContext->_vptr_RenderContext = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if (CVar3 < UNORM_INT8) {
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0,local_4c0 + 1);
    }
    if (local_4b0 != &local_4a0) {
      operator_delete(local_4b0,local_4a0 + 1);
    }
  }
  if (uniforms.m_gl != (Functions *)pdVar2) {
    operator_delete(uniforms.m_gl,uniforms._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_2.m_data._0_8_ != &local_628) {
    operator_delete((void *)res_2.m_data._0_8_,local_628._M_allocated_capacity + 1);
  }
  if (((local_66c != 1.0) || (NAN(local_66c))) && (local_570 != &local_560)) {
    operator_delete(local_570,local_560 + 1);
  }
  type.super_ApiType.m_bits = (ApiType)(*local_668->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar18 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar18,(allocator<char> *)&program);
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset(&uniforms,0,0xac);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&__str);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_398,(Functional *)(ulong)formatType,(TextureType)local_668,renderContext);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    uVar19 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_398._M_string_length + __str._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      uVar19 = local_398.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_398._M_string_length + __str._M_string_length) goto LAB_014960b3;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_398,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
  }
  else {
LAB_014960b3:
    puVar17 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&__str,(ulong)local_398._M_dataplus._M_p);
  }
  local_438 = &local_428;
  plVar16 = puVar17 + 2;
  if ((long *)*puVar17 == plVar16) {
    local_428 = *plVar16;
    uStack_420 = puVar17[3];
  }
  else {
    local_428 = *plVar16;
    local_438 = (long *)*puVar17;
  }
  local_430 = puVar17[1];
  *puVar17 = plVar16;
  puVar17[1] = 0;
  *(undefined1 *)plVar16 = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_438);
  local_378 = &local_368;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_368 = *plVar22;
    lStack_360 = plVar16[3];
  }
  else {
    local_368 = *plVar22;
    local_378 = (long *)*plVar16;
  }
  local_370 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_378,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_358 = &local_348;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_348 = *plVar22;
    lStack_340 = plVar16[3];
  }
  else {
    local_348 = *plVar22;
    local_358 = (long *)*plVar16;
  }
  local_350 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_338 = &local_328;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_328 = *plVar22;
    lStack_320 = plVar16[3];
  }
  else {
    local_328 = *plVar22;
    local_338 = (long *)*plVar16;
  }
  local_330 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_338,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_318 = &local_308;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_308 = *plVar22;
    lStack_300 = plVar16[3];
  }
  else {
    local_308 = *plVar22;
    local_318 = (long *)*plVar16;
  }
  local_310 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_318);
  local_2f8 = &local_2e8;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_2e8 = *plVar22;
    lStack_2e0 = plVar16[3];
  }
  else {
    local_2e8 = *plVar22;
    local_2f8 = (long *)*plVar16;
  }
  local_2f0 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_2f8,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_2d8 = &local_2c8;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_2c8 = *plVar22;
    lStack_2c0 = plVar16[3];
  }
  else {
    local_2c8 = *plVar22;
    local_2d8 = (long *)*plVar16;
  }
  local_2d0 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8 = &local_2a8;
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_2a8 = *plVar22;
    lStack_2a0 = plVar16[3];
  }
  else {
    local_2a8 = *plVar22;
    local_2b8 = (long *)*plVar16;
  }
  local_2b0 = plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_530 = &local_520;
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_520 = *puVar23;
    lStack_518 = plVar16[3];
  }
  else {
    local_520 = *puVar23;
    local_530 = (ulong *)*plVar16;
  }
  local_528 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_530);
  local_510 = &local_500;
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_500 = *puVar23;
    lStack_4f8 = plVar16[3];
  }
  else {
    local_500 = *puVar23;
    local_510 = (ulong *)*plVar16;
  }
  local_508 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_510);
  local_4f0 = &local_4e0;
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_4e0 = *puVar23;
    lStack_4d8 = plVar16[3];
  }
  else {
    local_4e0 = *puVar23;
    local_4f0 = (ulong *)*plVar16;
  }
  local_4e8 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_5a8 = *puVar23;
    lStack_5a0 = plVar16[3];
    local_5b8 = &local_5a8;
  }
  else {
    local_5a8 = *puVar23;
    local_5b8 = (ulong *)*plVar16;
  }
  local_5b0 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if (formatType == TEXTURETYPE_BUFFER) {
    std::operator+(&local_490,"\timageStore(u_image, gx, ",&colorExpr);
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_490);
    local_550 = &local_540;
    puVar23 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar23) {
      local_540 = *puVar23;
      uStack_538 = puVar17[3];
    }
    else {
      local_540 = *puVar23;
      local_550 = (ulong *)*puVar17;
    }
    local_548 = puVar17[1];
    *puVar17 = puVar23;
    bVar28 = false;
LAB_0149669f:
    bVar6 = false;
  }
  else {
    if (2 < formatType - TEXTURETYPE_CUBE) {
      if (formatType != TEXTURETYPE_2D) {
        local_550 = &local_540;
        uVar19 = std::__throw_logic_error("basic_string::_M_construct null not valid");
        if (local_5b8 != &local_5a8) {
          operator_delete(local_5b8,local_5a8 + 1);
        }
        if (local_4f0 != &local_4e0) {
          operator_delete(local_4f0,local_4e0 + 1);
        }
        if (local_510 != &local_500) {
          operator_delete(local_510,local_500 + 1);
        }
        if (local_530 != &local_520) {
          operator_delete(local_530,local_520 + 1);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,local_2c8 + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8 + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378,local_368 + 1);
        }
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        glu::ProgramSources::~ProgramSources((ProgramSources *)&uniforms);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
          operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                          glslVersionDeclaration.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)colorExpr._M_dataplus._M_p != &colorExpr.field_2) {
          operator_delete(colorExpr._M_dataplus._M_p,colorExpr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)colorBaseExpr._M_dataplus._M_p != &colorBaseExpr.field_2) {
          operator_delete(colorBaseExpr._M_dataplus._M_p,
                          colorBaseExpr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
          operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                          shaderImageTypeStr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
          operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                          shaderImageFormatStr.field_2._M_allocated_capacity + 1);
        }
        glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&textureBuf.super_ObjectWrapper);
        glu::CallLogWrapper::~CallLogWrapper(&glLog);
        _Unwind_Resume(uVar19);
      }
      std::operator+(&local_490,"\timageStore(u_image, ivec2(gx, gy), ",&colorExpr);
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_490);
      local_550 = &local_540;
      puVar23 = puVar17 + 2;
      if ((ulong *)*puVar17 == puVar23) {
        local_540 = *puVar23;
        uStack_538 = puVar17[3];
      }
      else {
        local_540 = *puVar23;
        local_550 = (ulong *)*puVar17;
      }
      local_548 = puVar17[1];
      *puVar17 = puVar23;
      bVar28 = true;
      goto LAB_0149669f;
    }
    std::operator+(&local_490,"\timageStore(u_image, ivec3(gx, gy, gz), ",&colorExpr);
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_490);
    local_550 = &local_540;
    puVar23 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar23) {
      local_540 = *puVar23;
      uStack_538 = puVar17[3];
    }
    else {
      local_540 = *puVar23;
      local_550 = (ulong *)*puVar17;
    }
    local_548 = puVar17[1];
    *puVar17 = puVar23;
    bVar6 = true;
    bVar28 = false;
  }
  puVar17[1] = 0;
  *(undefined1 *)puVar23 = 0;
  uVar13 = 0xf;
  if (local_5b8 != &local_5a8) {
    uVar13 = local_5a8;
  }
  if (uVar13 < (ulong)(local_548 + local_5b0)) {
    uVar13 = 0xf;
    if (local_550 != &local_540) {
      uVar13 = local_540;
    }
    if ((ulong)(local_548 + local_5b0) <= uVar13) {
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_550,0,(char *)0x0,(ulong)local_5b8);
      goto LAB_0149674a;
    }
  }
  puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_550);
LAB_0149674a:
  plVar16 = puVar17 + 2;
  if ((long *)*puVar17 == plVar16) {
    local_588 = *plVar16;
    uStack_580 = puVar17[3];
    local_598 = &local_588;
  }
  else {
    local_588 = *plVar16;
    local_598 = (long *)*puVar17;
  }
  local_590 = puVar17[1];
  *puVar17 = plVar16;
  puVar17[1] = 0;
  *(undefined1 *)plVar16 = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_598);
  local_5d8 = &local_5c8;
  puVar23 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar23) {
    local_5c8 = *puVar23;
    lStack_5c0 = plVar16[3];
  }
  else {
    local_5c8 = *puVar23;
    local_5d8 = (ulong *)*plVar16;
  }
  local_5d0 = plVar16[1];
  *plVar16 = (long)puVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  res_2.m_data[0] = 7.00649e-45;
  res_2.m_data._8_8_ = local_628._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(res_2.m_data + 2),local_5d8,local_5d0 + (long)local_5d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&uniforms.m_gl + (res_2.m_data._0_8_ & 0xffffffff) * 3),
              (value_type *)(res_2.m_data + 2));
  glu::ShaderProgram::ShaderProgram(&program,local_668,(ProgramSources *)&uniforms);
  if ((char *)res_2.m_data._8_8_ != local_628._M_local_buf + 8) {
    operator_delete((void *)res_2.m_data._8_8_,local_628._8_8_ + 1);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,local_5c8 + 1);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598,local_588 + 1);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550,local_540 + 1);
  }
  if ((bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2)) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((bVar28) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2)) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = local_610;
  if ((formatType == TEXTURETYPE_BUFFER) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2)) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,local_5a8 + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510,local_500 + 1);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530,local_520 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348 + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&uniforms.m_gl + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  iVar9 = (*local_668->_vptr_RenderContext[3])();
  uniforms.m_gl = (Functions *)CONCAT44(extraout_var_02,iVar9);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_log = pTVar5;
  uniforms.m_programGL = program.m_program.m_program;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(pTVar5,&program);
  local_610 = (TestLog *)CONCAT71(local_610._1_7_,program.m_program.m_info.linkOk);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_578->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,program.m_program.m_program);
    if (local_578->m_singleLayerBind == true) {
      if (0 < (int)local_65c) {
        iVar9 = local_678.m_data[0];
        num_groups_y = local_678.m_data[1];
        uVar26 = 0;
        do {
          if (uVar26 != 0) {
            glu::CallLogWrapper::glMemoryBarrier(&glLog,0x20);
          }
          res_2.m_data._0_8_ = &local_628;
          std::__cxx11::string::_M_construct<char_const*>((string *)&res_2,"u_layerNdx","");
          UniformAccessLogger::assign1i(&uniforms,(string *)&res_2,uVar26);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)res_2.m_data._0_8_ != &local_628) {
            operator_delete((void *)res_2.m_data._0_8_,local_628._M_allocated_capacity + 1);
          }
          glu::CallLogWrapper::glBindImageTexture
                    (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\0',uVar26,0x88b9,dVar10);
          iVar11 = (*local_668->_vptr_RenderContext[3])();
          dVar12 = (**(code **)(CONCAT44(extraout_var_03,iVar11) + 0x800))();
          glu::checkError(dVar12,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x4cb);
          glu::CallLogWrapper::glDispatchCompute(&glLog,iVar9,num_groups_y,1);
          iVar11 = (*local_668->_vptr_RenderContext[3])();
          dVar12 = (**(code **)(CONCAT44(extraout_var_04,iVar11) + 0x800))();
          glu::checkError(dVar12,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x4ce);
          uVar26 = uVar26 + 1;
        } while (local_65c != uVar26);
      }
    }
    else {
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar10);
      iVar9 = (*local_668->_vptr_RenderContext[3])();
      dVar10 = (**(code **)(CONCAT44(extraout_var_05,iVar9) + 0x800))();
      glu::checkError(dVar10,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d4);
      glu::CallLogWrapper::glDispatchCompute
                (&glLog,local_678.m_data[0],local_678.m_data[1],local_65c);
      iVar9 = (*local_668->_vptr_RenderContext[3])();
      dVar10 = (**(code **)(CONCAT44(extraout_var_06,iVar9) + 0x800))();
      glu::checkError(dVar10,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d7);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram(&program);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorExpr._M_dataplus._M_p != &colorExpr.field_2) {
    operator_delete(colorExpr._M_dataplus._M_p,colorExpr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorBaseExpr._M_dataplus._M_p != &colorBaseExpr.field_2) {
    operator_delete(colorBaseExpr._M_dataplus._M_p,colorBaseExpr.field_2._M_allocated_capacity + 1);
  }
  pIVar7 = local_578;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_610 != '\0') {
    CVar3 = (pIVar7->m_format).type;
    if ((0x21 < (ulong)CVar3) || (bVar28 = true, (0x2c0000000U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
    {
      bVar28 = CVar3 - SIGNED_INT8 < 3;
    }
    iVar9 = local_678.m_data[0];
    local_610 = (TestLog *)CONCAT44(local_610._4_4_,local_678.m_data[1]);
    LayeredImage::LayeredImage
              ((LayeredImage *)&program,pIVar7->m_textureType,format,local_678.m_data[0],
               local_678.m_data[1],local_678.m_data[2]);
    if (0 < (int)local_65c) {
      uVar26 = 0;
      do {
        if (0 < (int)(uint)local_610) {
          y = 0;
          do {
            if (0 < iVar9) {
              uVar27 = ~y + (uint)local_610 ^ uVar26;
              x = 0;
              do {
                uniforms.m_gl = (Functions *)CONCAT44(y ^ uVar26 ^ ~x + iVar9,y ^ uVar26 ^ x);
                uniforms.m_log = (TestLog *)CONCAT44(~x + iVar9 ^ uVar27,uVar27 ^ x);
                if (bVar28) {
                  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                            ((LayeredImage *)&program,x,y,uVar26,(Vector<int,_4> *)&uniforms);
                }
                else {
                  shaderImageTypeStr._M_dataplus._M_p = (pointer)0x0;
                  shaderImageTypeStr._M_string_length = 0;
                  lVar24 = 0;
                  do {
                    *(float *)((long)&shaderImageTypeStr._M_dataplus._M_p + lVar24 * 4) =
                         (float)*(int *)((long)&uniforms.m_gl + lVar24 * 4);
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 4);
                  shaderImageFormatStr._M_dataplus._M_p = (pointer)0x0;
                  shaderImageFormatStr._M_string_length = 0;
                  lVar24 = 0;
                  do {
                    *(float *)((long)&shaderImageFormatStr._M_dataplus._M_p + lVar24 * 4) =
                         *(float *)((long)&shaderImageTypeStr._M_dataplus._M_p + lVar24 * 4) *
                         local_66c;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 4);
                  res_2.m_data[0] = 0.0;
                  res_2.m_data[1] = 0.0;
                  res_2.m_data[2] = 0.0;
                  res_2.m_data[3] = 0.0;
                  lVar24 = 0;
                  do {
                    res_2.m_data[lVar24] =
                         *(float *)((long)&shaderImageFormatStr._M_dataplus._M_p + lVar24 * 4) +
                         fVar29;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 4);
                  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                            ((LayeredImage *)&program,x,y,uVar26,&res_2);
                }
                x = x + 1;
              } while (x != iVar9);
            }
            y = y + 1;
          } while (y != (uint)local_610);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != local_65c);
    }
    pIVar7 = local_578;
    uniforms.m_gl = (Functions *)&PTR_operator___0219e960;
    uniforms.m_log = (TestLog *)&program;
    uniforms._20_4_ =
         program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_finish._0_4_;
    uniforms.m_programGL =
         program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start._4_4_;
    bVar28 = readTextureAndVerify
                       (local_668,&glLog,texture.super_ObjectWrapper.m_object,
                        textureBuf.super_ObjectWrapper.m_object,local_578->m_textureType,format,
                        &local_678,(ImageLayerVerifier *)&uniforms);
    pcVar18 = "Image comparison failed";
    if (bVar28) {
      pcVar18 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pIVar7->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar28,
               pcVar18);
    LayeredImage::~LayeredImage((LayeredImage *)&program);
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&textureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageStoreCase::IterateResult ImageStoreCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize				= defaultImageSize(m_textureType);
	const int					numSlicesOrFaces		= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const int					maxImageDimension		= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale			= isFormatTypeUnorm(m_format.type) ? 1.0f / (float)(maxImageDimension - 1)
														: isFormatTypeSnorm(m_format.type) ? 2.0f / (float)(maxImageDimension - 1)
														: 1.0f;
	const float					storeColorBias			= isFormatTypeSnorm(m_format.type) ? -1.0f : 0.0f;
	const glu::Buffer			textureBuf				(renderCtx); // \note Only really used if using buffer texture.
	const glu::Texture			texture					(renderCtx);

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *textureBuf << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, internalFormatGL, imageSize, *textureBuf);

	// Perform image stores in compute shader.

	{
		// Generate compute shader.

		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const TextureType	shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, shaderImageType);
		const bool			isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
		const bool			isIntFormat				= isFormatTypeSignedInteger(m_format.type);
		const string		colorBaseExpr			= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4(gx^gy^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^gy^gz, "
																												 "gx^(" + toString(imageSize.y()-1) + "-gy)^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^(" + toString(imageSize.y()-1) + "-gy)^gz)";
		const string		colorExpr				= colorBaseExpr + (storeColorScale == 1.0f ? "" : "*" + toString(storeColorScale))
																	+ (storeColorBias == 0.0f ? "" : " + float(" + toString(storeColorBias) + ")");
		const std::string	glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) writeonly uniform " + shaderImageTypeStr + " u_image;\n"
														+ (m_singleLayerBind ? "uniform int u_layerNdx;\n" : "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = " + (m_singleLayerBind ? "u_layerNdx" : "int(gl_GlobalInvocationID.z)") + ";\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	imageStore(u_image, gx, " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	imageStore(u_image, ivec2(gx, gy), " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	imageStore(u_image, ivec3(gx, gy, gz), " + colorExpr + ");\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				uniforms.assign1i("u_layerNdx", layerNdx);

				glLog.glBindImageTexture(0, *texture, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, internalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}
	}

	// Create reference, read texture and compare to reference.
	{
		const int		isIntegerFormat		= isFormatTypeInteger(m_format.type);
		LayeredImage	reference			(m_textureType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		DE_ASSERT(!isIntegerFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x(); x++)
		{
			const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

			if (isIntegerFormat)
				reference.setPixel(x, y, z, color);
			else
				reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
		}

		const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture, *textureBuf, m_textureType, m_format, imageSize, ImageLayerComparer(reference));

		m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
		return STOP;
	}
}